

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

Vec_Ptr_t * Saig_ManWindowOutline(Aig_Man_t *p,Aig_Obj_t *pObj,int nDist)

{
  int iVar1;
  int iVar2;
  int *pDists_00;
  Vec_Ptr_t *vNodes_00;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  int local_44;
  int i;
  int *pDists;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Vec_Ptr_t *vNodes;
  int nDist_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  pDists_00 = (int *)calloc((long)iVar1,4);
  vNodes_00 = Vec_PtrAlloc(1000);
  Aig_ManIncrementTravId(p);
  Saig_ManWindowOutline_rec(p,pObj,nDist,vNodes_00,pDists_00);
  Vec_PtrSort(vNodes_00,Aig_ObjCompareIdIncrease);
  local_44 = 0;
  while( true ) {
    iVar1 = Saig_ManRegNum(p);
    if (iVar1 <= local_44) {
      if (pDists_00 != (int *)0x0) {
        free(pDists_00);
      }
      return vNodes_00;
    }
    pObj_00 = Saig_ManLi(p,local_44);
    pObj_01 = Saig_ManLo(p,local_44);
    iVar1 = Aig_ObjIsTravIdCurrent(p,pObj_00);
    iVar2 = Aig_ObjIsTravIdCurrent(p,pObj_01);
    if (iVar1 != iVar2) break;
    local_44 = local_44 + 1;
  }
  __assert_fail("Aig_ObjIsTravIdCurrent(p, pObjLi) == Aig_ObjIsTravIdCurrent(p, pObjLo)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                ,0x71,"Vec_Ptr_t *Saig_ManWindowOutline(Aig_Man_t *, Aig_Obj_t *, int)");
}

Assistant:

Vec_Ptr_t * Saig_ManWindowOutline( Aig_Man_t * p, Aig_Obj_t * pObj, int nDist )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObjLi, * pObjLo;
    int * pDists, i;
    pDists = ABC_CALLOC( int, Aig_ManObjNumMax(p) );
    vNodes = Vec_PtrAlloc( 1000 );
    Aig_ManIncrementTravId( p );
    Saig_ManWindowOutline_rec( p, pObj, nDist, vNodes, pDists );
    Vec_PtrSort( vNodes, (int (*)(void))Aig_ObjCompareIdIncrease );
    // make sure LI/LO are labeled/unlabeled mutually
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        assert( Aig_ObjIsTravIdCurrent(p, pObjLi) == 
                Aig_ObjIsTravIdCurrent(p, pObjLo) );
    ABC_FREE( pDists );
    return vNodes;
}